

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batch_memory_manager.hpp
# Opt level: O1

void __thiscall duckdb::BatchMemoryManager::SetMemorySize(BatchMemoryManager *this,idx_t size)

{
  BufferManager *this_00;
  idx_t iVar1;
  pointer pTVar2;
  ulong new_remaining_size;
  
  this_00 = BufferManager::GetBufferManager(this->context);
  iVar1 = BufferManager::GetQueryMaxMemory(this_00);
  new_remaining_size = iVar1 >> 2;
  if (size < iVar1 >> 2) {
    new_remaining_size = size;
  }
  if ((this->available_memory).super___atomic_base<unsigned_long>._M_i < new_remaining_size) {
    pTVar2 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
             ::operator->(&this->memory_state);
    TemporaryMemoryState::SetRemainingSizeAndUpdateReservation
              (pTVar2,this->context,new_remaining_size);
    pTVar2 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
             ::operator->(&this->memory_state);
    iVar1 = TemporaryMemoryState::GetReservation(pTVar2);
    if (iVar1 <= (this->available_memory).super___atomic_base<unsigned_long>._M_i) {
      this->can_increase_memory = false;
    }
    LOCK();
    (this->available_memory).super___atomic_base<unsigned_long>._M_i = iVar1;
    UNLOCK();
  }
  return;
}

Assistant:

void SetMemorySize(idx_t size) {
		// request at most 1/4th of all available memory
		idx_t total_max_memory = BufferManager::GetBufferManager(context).GetQueryMaxMemory();
		idx_t request_cap = total_max_memory / 4;

		size = MinValue<idx_t>(size, request_cap);
		if (size <= available_memory) {
			return;
		}

		memory_state->SetRemainingSizeAndUpdateReservation(context, size);
		auto next_reservation = memory_state->GetReservation();
		if (available_memory >= next_reservation) {
			// we tried to ask for more memory but were declined
			// stop asking for more memory
			can_increase_memory = false;
		}
		available_memory = next_reservation;
	}